

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O1

optional<unsigned_long_long> __thiscall
yactfr::internal::StrScanner::_tryScanConstInt<unsigned_long_long,10>(StrScanner *this,bool negate)

{
  char *__nptr;
  int iVar1;
  ulonglong uVar2;
  int *piVar3;
  undefined8 uVar4;
  ulonglong in_RDX;
  ulonglong extraout_RDX;
  ulonglong extraout_RDX_00;
  optional<unsigned_long_long> oVar5;
  char *strEnd;
  char *local_20;
  
  __nptr = this->_at;
  if ((((ulong)((long)this->_end - (long)__nptr) < 2) || (*__nptr != '0')) ||
     ((byte)(__nptr[1] | 0x20U) != 0x78)) {
    if (this->_end != __nptr) {
      iVar1 = isxdigit((int)*__nptr);
      in_RDX = extraout_RDX;
      if (iVar1 == 0) goto LAB_0021dc91;
    }
    local_20 = (char *)0x0;
    uVar2 = strtoull(__nptr,&local_20,10);
    if ((uVar2 != 0) || (this->_at != local_20)) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x22) {
        in_RDX = -uVar2;
        if (!negate) {
          in_RDX = uVar2;
        }
        this->_at = local_20;
        uVar4 = CONCAT71((int7)((ulong)local_20 >> 8),1);
        goto LAB_0021dcad;
      }
    }
    piVar3 = __errno_location();
    *piVar3 = 0;
    in_RDX = extraout_RDX_00;
  }
LAB_0021dc91:
  uVar4 = 0;
LAB_0021dcad:
  oVar5.super_type.m_storage = in_RDX;
  oVar5.super_type._0_8_ = uVar4;
  return (optional<unsigned_long_long>)oVar5.super_type;
}

Assistant:

boost::optional<ValT> StrScanner::_tryScanConstInt(const bool negate)
{
    /*
     * Only accept hex characters for the first two characters at this
     * point, as std::strtoull() will accept a hexadecimal radix prefix,
     * whitespaces, `-`, and `+`.
     */
    if (this->charsLeft() >= 2 && _at[0] == '0') {
        if (_at[1] == 'x' || _at[1] == 'X') {
            // we already scanned any prefix, if allowed
            return boost::none;
        }
    }

    if (this->charsLeft() >= 1 && !std::isxdigit(*_at)) {
        return boost::none;
    }

    char *strEnd = nullptr;
    const auto ullVal = std::strtoull(_at, &strEnd, BaseV);

    if ((ullVal == 0 && &(*_at) == strEnd) || errno == ERANGE) {
        // could not parse
        errno = 0;
        return boost::none;
    }

    {
        const auto val = this->_tryNegateConstInt<ValT>(ullVal, negate);

        if (val) {
            // success: update position
            _at += (strEnd - &(*_at));
        }

        return val;
    }
}